

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O0

void __thiscall RX::RX(RX *this)

{
  allocator<char> local_11;
  RX *local_10;
  RX *this_local;
  
  this->_compiled = false;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_pattern,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->_case_sensitive = true;
  return;
}

Assistant:

RX::RX ()
: _compiled (false)
, _pattern ("")
, _case_sensitive (true)
{
}